

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::java::JavaGenerator::Generate
          (JavaGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  FileGenerator *pFVar6;
  undefined4 extraout_var;
  ZeroCopyOutputStream *output;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *annotation_collector_00;
  ulong uVar8;
  long lVar9;
  int i_1;
  ulong uVar10;
  int j;
  vector<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
  file_generators;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  Options file_options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_annotations;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_files;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  string info_full_path;
  string java_filename;
  string local_140;
  Printer printer;
  string package_dir;
  GeneratedCodeInfo annotations;
  ZeroCopyOutputStream *pZVar7;
  undefined4 extraout_var_00;
  
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseGeneratorParameter(parameter,&options);
  file_options.annotation_list_file._M_dataplus._M_p =
       (pointer)&file_options.annotation_list_file.field_2;
  lVar9 = 0;
  file_options.annotate_code = false;
  file_options.generate_immutable_code = false;
  file_options.generate_mutable_code = false;
  file_options.generate_shared_code = false;
  file_options.enforce_lite = false;
  file_options.annotation_list_file._M_string_length = 0;
  file_options.annotation_list_file.field_2._M_local_buf[0] = '\0';
  file_options.output_list_file._M_dataplus._M_p = (pointer)&file_options.output_list_file.field_2;
  file_options.output_list_file._M_string_length = 0;
  file_options.output_list_file.field_2._M_local_buf[0] = '\0';
  for (uVar10 = 0;
      uVar10 < (ulong)((long)options.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)options.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 6); uVar10 = uVar10 + 1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&((options.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus
                                    ._M_p + lVar9),"output_list_file");
    if (bVar1) {
      psVar5 = (string *)&file_options.output_list_file;
LAB_00293364:
      std::__cxx11::string::_M_assign(psVar5);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&((options.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first).
                                      _M_dataplus._M_p + lVar9),"immutable");
      if (bVar1) {
        file_options.generate_immutable_code = true;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&((options.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->first).
                                         _M_dataplus._M_p + lVar9),"mutable");
        if (bVar1) {
          file_options.generate_mutable_code = true;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&((options.
                                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first).
                                             _M_dataplus._M_p + lVar9),"shared");
          if (bVar1) {
            file_options.generate_shared_code = true;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&((options.
                                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->first).
                                               _M_dataplus._M_p + lVar9),"lite");
            if (bVar1) {
              file_options.enforce_lite = true;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&((options.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->first)
                                                 ._M_dataplus._M_p + lVar9),"annotate_code");
              if (!bVar1) {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&((options.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->first)
                                                  ._M_dataplus._M_p + lVar9),"annotation_list_file")
                ;
                if (bVar1) {
                  psVar5 = (string *)&file_options.annotation_list_file;
                  goto LAB_00293364;
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &printer,"Unknown generator option: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&((options.
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->first).
                                       _M_dataplus._M_p + lVar9));
                std::__cxx11::string::operator=((string *)error,(string *)&printer);
                std::__cxx11::string::~string((string *)&printer);
                goto LAB_00293459;
              }
              file_options.annotate_code = true;
            }
          }
        }
      }
    }
    lVar9 = lVar9 + 0x40;
  }
  bVar1 = file_options.enforce_lite;
  if ((file_options.enforce_lite != true) || (file_options.generate_mutable_code != true)) {
    cVar2 = file_options.generate_immutable_code;
    if ((file_options.generate_immutable_code == false) &&
       ((file_options.generate_mutable_code == false && (file_options.generate_shared_code == false)
        ))) {
      cVar2 = '\x01';
      file_options.generate_immutable_code = true;
      file_options.generate_shared_code = true;
      file_options._0_4_ = CONCAT13(bVar1,file_options._0_3_);
    }
    all_files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    all_files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    all_annotations.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_annotations.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    all_annotations.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    file_generators.
    super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    file_generators.
    super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    file_generators.
    super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (cVar2 != '\0') {
      pFVar6 = (FileGenerator *)operator_new(0xe0);
      FileGenerator::FileGenerator(pFVar6,file,&file_options,true);
      printer._0_8_ = pFVar6;
      std::
      vector<google::protobuf::compiler::java::FileGenerator*,std::allocator<google::protobuf::compiler::java::FileGenerator*>>
      ::emplace_back<google::protobuf::compiler::java::FileGenerator*>
                ((vector<google::protobuf::compiler::java::FileGenerator*,std::allocator<google::protobuf::compiler::java::FileGenerator*>>
                  *)&file_generators,(FileGenerator **)&printer);
    }
    if (file_options.generate_mutable_code == true) {
      pFVar6 = (FileGenerator *)operator_new(0xe0);
      FileGenerator::FileGenerator(pFVar6,file,&file_options,false);
      printer._0_8_ = pFVar6;
      std::
      vector<google::protobuf::compiler::java::FileGenerator*,std::allocator<google::protobuf::compiler::java::FileGenerator*>>
      ::emplace_back<google::protobuf::compiler::java::FileGenerator*>
                ((vector<google::protobuf::compiler::java::FileGenerator*,std::allocator<google::protobuf::compiler::java::FileGenerator*>>
                  *)&file_generators,(FileGenerator **)&printer);
    }
    uVar10 = 0;
LAB_0029352a:
    uVar8 = (long)file_generators.
                  super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)file_generators.
                  super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3;
    bVar1 = uVar8 <= uVar10;
    if (uVar10 < uVar8) goto code_r0x00293547;
    for (uVar10 = 0;
        uVar10 < (ulong)((long)file_generators.
                               super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)file_generators.
                               super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar10 = uVar10 + 1)
    {
      pFVar6 = file_generators.
               super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10];
      std::__cxx11::string::string((string *)&local_140,(string *)&pFVar6->java_package_);
      JavaPackageToDir(&package_dir,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::string((string *)&java_filename,(string *)&package_dir);
      std::__cxx11::string::append((string *)&java_filename);
      std::__cxx11::string::append((char *)&java_filename);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&all_files,&java_filename);
      std::operator+(&info_full_path,&java_filename,".pb.meta");
      if (file_options.annotate_code == true) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&all_annotations,&info_full_path);
      }
      iVar4 = (*context->_vptr_GeneratorContext[2])(context,&java_filename);
      pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar4);
      GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
      annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
           (_func_int **)&PTR_AddAnnotation_004d7460;
      annotation_collector_00 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0
      ;
      if (file_options.annotate_code != false) {
        annotation_collector_00 = &annotation_collector;
      }
      annotation_collector.annotation_proto_ = &annotations;
      io::Printer::Printer(&printer,pZVar7,'$',&annotation_collector_00->super_AnnotationCollector);
      FileGenerator::Generate(pFVar6,&printer);
      FileGenerator::GenerateSiblings(pFVar6,&package_dir,context,&all_files,&all_annotations);
      if (file_options.annotate_code == true) {
        iVar4 = (*context->_vptr_GeneratorContext[2])(context,&info_full_path);
        output = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar4);
        MessageLite::SerializeToZeroCopyStream((MessageLite *)&annotations,output);
        if (output != (ZeroCopyOutputStream *)0x0) {
          (*output->_vptr_ZeroCopyOutputStream[1])(output);
        }
      }
      io::Printer::~Printer(&printer);
      GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
      if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
      }
      std::__cxx11::string::~string((string *)&info_full_path);
      std::__cxx11::string::~string((string *)&java_filename);
      std::__cxx11::string::~string((string *)&package_dir);
    }
    for (uVar10 = 0;
        uVar10 < (ulong)((long)file_generators.
                               super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)file_generators.
                               super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar10 = uVar10 + 1)
    {
      pFVar6 = file_generators.
               super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10];
      if (pFVar6 != (FileGenerator *)0x0) {
        FileGenerator::~FileGenerator(pFVar6);
      }
      operator_delete(pFVar6);
    }
    if (file_generators.
        super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        file_generators.
        super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      file_generators.
      super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           file_generators.
           super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    if (file_options.output_list_file._M_string_length != 0) {
      iVar4 = (*context->_vptr_GeneratorContext[2])(context,&file_options.output_list_file);
      pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar4);
      io::Printer::Printer(&printer,pZVar7,'$');
      lVar9 = 0;
      for (uVar10 = 0;
          uVar10 < (ulong)((long)all_files.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)all_files.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar10 = uVar10 + 1) {
        io::Printer::Print<char[9],std::__cxx11::string>
                  (&printer,"$filename$\n",(char (*) [9])"filename",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&((all_files.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9))
        ;
        lVar9 = lVar9 + 0x20;
      }
      io::Printer::~Printer(&printer);
      if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
      }
    }
    if (file_options.annotation_list_file._M_string_length != 0) {
      iVar4 = (*context->_vptr_GeneratorContext[2])(context,&file_options.annotation_list_file);
      pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar4);
      io::Printer::Printer(&printer,pZVar7,'$');
      lVar9 = 0;
      for (uVar10 = 0;
          uVar10 < (ulong)((long)all_annotations.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)all_annotations.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar10 = uVar10 + 1) {
        io::Printer::Print<char[9],std::__cxx11::string>
                  (&printer,"$filename$\n",(char (*) [9])"filename",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&((all_annotations.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9))
        ;
        lVar9 = lVar9 + 0x20;
      }
      io::Printer::~Printer(&printer);
      if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
      }
    }
    goto LAB_00293904;
  }
  std::__cxx11::string::assign((char *)error);
LAB_00293459:
  bVar1 = false;
LAB_0029392c:
  Options::~Options(&file_options);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&options);
  return bVar1;
code_r0x00293547:
  bVar3 = FileGenerator::Validate
                    (file_generators.
                     super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar10],error);
  uVar10 = uVar10 + 1;
  if (!bVar3) goto code_r0x0029355a;
  goto LAB_0029352a;
code_r0x0029355a:
  for (uVar10 = 0;
      uVar10 < (ulong)((long)file_generators.
                             super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)file_generators.
                             super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar10 = uVar10 + 1) {
    pFVar6 = file_generators.
             super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar10];
    if (pFVar6 != (FileGenerator *)0x0) {
      FileGenerator::~FileGenerator(pFVar6);
    }
    operator_delete(pFVar6);
  }
LAB_00293904:
  std::
  _Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
  ::~_Vector_base(&file_generators.
                   super__Vector_base<google::protobuf::compiler::java::FileGenerator_*,_std::allocator<google::protobuf::compiler::java::FileGenerator_*>_>
                 );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&all_annotations);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&all_files);
  goto LAB_0029392c;
}

Assistant:

bool JavaGenerator::Generate(const FileDescriptor* file,
                             const std::string& parameter,
                             GeneratorContext* context,
                             std::string* error) const {
  // -----------------------------------------------------------------
  // parse generator options

  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);
  Options file_options;

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "output_list_file") {
      file_options.output_list_file = options[i].second;
    } else if (options[i].first == "immutable") {
      file_options.generate_immutable_code = true;
    } else if (options[i].first == "mutable") {
      file_options.generate_mutable_code = true;
    } else if (options[i].first == "shared") {
      file_options.generate_shared_code = true;
    } else if (options[i].first == "lite") {
      // Note: Java Lite does not guarantee API/ABI stability. We may choose to
      // break existing API in order to boost performance / reduce code size.
      file_options.enforce_lite = true;
    } else if (options[i].first == "annotate_code") {
      file_options.annotate_code = true;
    } else if (options[i].first == "annotation_list_file") {
      file_options.annotation_list_file = options[i].second;
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  if (file_options.enforce_lite && file_options.generate_mutable_code) {
    *error = "lite runtime generator option cannot be used with mutable API.";
    return false;
  }

  // By default we generate immutable code and shared code for immutable API.
  if (!file_options.generate_immutable_code &&
      !file_options.generate_mutable_code &&
      !file_options.generate_shared_code) {
    file_options.generate_immutable_code = true;
    file_options.generate_shared_code = true;
  }

  // -----------------------------------------------------------------


  std::vector<std::string> all_files;
  std::vector<std::string> all_annotations;


  std::vector<FileGenerator*> file_generators;
  if (file_options.generate_immutable_code) {
    file_generators.push_back(new FileGenerator(file, file_options,
                                                /* immutable = */ true));
  }
  if (file_options.generate_mutable_code) {
    file_generators.push_back(new FileGenerator(file, file_options,
                                                /* mutable = */ false));
  }

  for (int i = 0; i < file_generators.size(); ++i) {
    if (!file_generators[i]->Validate(error)) {
      for (int j = 0; j < file_generators.size(); ++j) {
        delete file_generators[j];
      }
      return false;
    }
  }

  for (int i = 0; i < file_generators.size(); ++i) {
    FileGenerator* file_generator = file_generators[i];

    std::string package_dir = JavaPackageToDir(file_generator->java_package());

    std::string java_filename = package_dir;
    java_filename += file_generator->classname();
    java_filename += ".java";
    all_files.push_back(java_filename);
    std::string info_full_path = java_filename + ".pb.meta";
    if (file_options.annotate_code) {
      all_annotations.push_back(info_full_path);
    }

    // Generate main java file.
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        context->Open(java_filename));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    io::Printer printer(
        output.get(), '$',
        file_options.annotate_code ? &annotation_collector : NULL);

    file_generator->Generate(&printer);

    // Generate sibling files.
    file_generator->GenerateSiblings(package_dir, context, &all_files,
                                     &all_annotations);

    if (file_options.annotate_code) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          context->Open(info_full_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }


  for (int i = 0; i < file_generators.size(); ++i) {
    delete file_generators[i];
  }
  file_generators.clear();

  // Generate output list if requested.
  if (!file_options.output_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .java files being generated.
    std::unique_ptr<io::ZeroCopyOutputStream> srclist_raw_output(
        context->Open(file_options.output_list_file));
    io::Printer srclist_printer(srclist_raw_output.get(), '$');
    for (int i = 0; i < all_files.size(); i++) {
      srclist_printer.Print("$filename$\n", "filename", all_files[i]);
    }
  }

  if (!file_options.annotation_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .java files being generated.
    std::unique_ptr<io::ZeroCopyOutputStream> annotation_list_raw_output(
        context->Open(file_options.annotation_list_file));
    io::Printer annotation_list_printer(annotation_list_raw_output.get(), '$');
    for (int i = 0; i < all_annotations.size(); i++) {
      annotation_list_printer.Print("$filename$\n", "filename",
                                    all_annotations[i]);
    }
  }

  return true;
}